

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateSerializedSizeCode
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if ($is_field_present_message$) {\n  size += com.google.protobuf.CodedOutputStream\n    .computeStringSize($number$, get$capitalized_name$());\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  // Lite runtime should reduce allocations by computing on the string directly.
  // This avoids spurious intermediary ByteString allocations, cutting overall
  // allocations in half.
  printer->Print(variables_,
    "if ($is_field_present_message$) {\n"
    "  size += com.google.protobuf.CodedOutputStream\n"
    "    .computeStringSize($number$, get$capitalized_name$());\n"
    "}\n");
}